

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

unsigned_long xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,xmlNodePtr node)

{
  bool bVar1;
  byte bVar2;
  xmlParserNodeInfoSeqPtr pxStack_38;
  int found;
  unsigned_long middle;
  unsigned_long lower;
  unsigned_long upper;
  xmlNodePtr node_local;
  xmlParserNodeInfoSeqPtr seq_local;
  
  bVar2 = 0;
  if ((seq == (xmlParserNodeInfoSeqPtr)0x0) || (node == (xmlNodePtr)0x0)) {
    seq_local = (xmlParserNodeInfoSeqPtr)0xffffffffffffffff;
  }
  else {
    middle = 1;
    lower = seq->length;
    pxStack_38 = (xmlParserNodeInfoSeqPtr)0x0;
    while( true ) {
      bVar1 = false;
      if (middle <= lower) {
        bVar1 = (bool)(bVar2 ^ 1);
      }
      if (!bVar1) break;
      pxStack_38 = (xmlParserNodeInfoSeqPtr)(middle + (lower - middle >> 1));
      if (node == seq->buffer[(long)((long)&pxStack_38[-1].buffer + 7)].node) {
        bVar2 = 1;
      }
      else if (node < seq->buffer[(long)((long)&pxStack_38[-1].buffer + 7)].node) {
        lower = (long)&pxStack_38[-1].buffer + 7;
      }
      else {
        middle = (long)&pxStack_38->maximum + 1;
      }
    }
    if ((pxStack_38 == (xmlParserNodeInfoSeqPtr)0x0) ||
       (seq->buffer[(long)((long)&pxStack_38[-1].buffer + 7)].node < node)) {
      seq_local = pxStack_38;
    }
    else {
      seq_local = (xmlParserNodeInfoSeqPtr)((long)&pxStack_38[-1].buffer + 7);
    }
  }
  return (unsigned_long)seq_local;
}

Assistant:

unsigned long
xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,
                           xmlNodePtr node)
{
    unsigned long upper, lower, middle;
    int found = 0;

    if ((seq == NULL) || (node == NULL))
        return ((unsigned long) -1);

    /* Do a binary search for the key */
    lower = 1;
    upper = seq->length;
    middle = 0;
    while (lower <= upper && !found) {
        middle = lower + (upper - lower) / 2;
        if (node == seq->buffer[middle - 1].node)
            found = 1;
        else if (node < seq->buffer[middle - 1].node)
            upper = middle - 1;
        else
            lower = middle + 1;
    }

    /* Return position */
    if (middle == 0 || seq->buffer[middle - 1].node < node)
        return middle;
    else
        return middle - 1;
}